

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O1

void __thiscall
wasm::PrintExpressionContents::printAtomicRMWOp(PrintExpressionContents *this,AtomicRMWOp op)

{
  char *pcVar1;
  ostream *poVar2;
  
  switch(op) {
  case RMWAdd:
    poVar2 = this->o;
    pcVar1 = "add";
    break;
  case RMWSub:
    poVar2 = this->o;
    pcVar1 = "sub";
    break;
  case RMWAnd:
    poVar2 = this->o;
    pcVar1 = "and";
    break;
  case RMWOr:
    std::__ostream_insert<char,std::char_traits<char>>(this->o,"or",2);
    return;
  case RMWXor:
    poVar2 = this->o;
    pcVar1 = "xor";
    break;
  case RMWXchg:
    std::__ostream_insert<char,std::char_traits<char>>(this->o,"xchg",4);
    return;
  default:
    handle_unreachable("unexpected rmw op",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Print.cpp"
                       ,0x2b7);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar1,3);
  return;
}

Assistant:

void printAtomicRMWOp(AtomicRMWOp op) {
    switch (op) {
      case RMWAdd:
        o << "add";
        return;
      case RMWSub:
        o << "sub";
        return;
      case RMWAnd:
        o << "and";
        return;
      case RMWOr:
        o << "or";
        return;
      case RMWXor:
        o << "xor";
        return;
      case RMWXchg:
        o << "xchg";
        return;
    }
    WASM_UNREACHABLE("unexpected rmw op");
  }